

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O1

uint32_t spvtools::opt::anon_unknown_0::PerformFloatingPointOperation
                   (ConstantManager *const_mgr,Op opcode,Constant *input1,Constant *input2)

{
  Type *type;
  double dVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  uint32_t uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Constant *c;
  Instruction *this;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  FloatProxy<float> val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  FloatProxy<double> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  undefined1 local_58 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  type = input1->type_;
  iVar6 = (*type->_vptr_Type[0xc])(type);
  if (CONCAT44(extraout_var,iVar6) == 0) {
    __assert_fail("type->AsFloat()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x229,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  iVar6 = (*type->_vptr_Type[0xc])(type);
  iVar6 = *(int *)(CONCAT44(extraout_var_00,iVar6) + 0x24);
  if ((iVar6 != 0x20) && (iVar6 != 0x40)) {
    __assert_fail("width == 32 || width == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x22b,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  }
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(opcode) {
  case OpFAdd:
    if (iVar6 == 0x40) {
      local_58._0_8_ = analysis::Constant::GetDouble(input1);
      dVar1 = analysis::Constant::GetDouble(input2);
      local_80.data_ = (uint_type)(dVar1 + (double)local_58._0_8_);
      goto LAB_00211341;
    }
    fVar8 = analysis::Constant::GetFloat(input1);
    local_58._0_4_ = fVar8;
    fVar8 = analysis::Constant::GetFloat(input2);
    fVar8 = fVar8 + (float)local_58._0_4_;
LAB_00211599:
    local_80.data_._0_4_ = fVar8;
    bVar5 = 2;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      if (NAN(fVar8)) {
LAB_002117a7:
        bVar5 = 0;
      }
      else {
        bVar5 = 1;
        if (ABS(fVar8) != INFINITY) goto LAB_002115e2;
      }
    }
LAB_002115e8:
    if ((bVar5 < 4) && (bVar5 != 2)) goto LAB_002115fa;
LAB_0021169e:
    utils::FloatProxy<float>::GetWords(&local_48,(FloatProxy<float> *)&local_80);
    goto LAB_002116b0;
  default:
    __assert_fail("false && \"Unexpected operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x24a,
                  "uint32_t spvtools::opt::(anonymous namespace)::PerformFloatingPointOperation(analysis::ConstantManager *, spv::Op, const analysis::Constant *, const analysis::Constant *)"
                 );
  case OpFSub:
    if (iVar6 != 0x40) {
      local_58._0_4_ = analysis::Constant::GetFloat(input1);
      local_58._4_4_ = extraout_XMM0_Db;
      local_58._8_4_ = extraout_XMM0_Dc_01;
      local_58._12_4_ = extraout_XMM0_Dd_01;
      fVar8 = analysis::Constant::GetFloat(input2);
      fVar8 = (float)local_58._0_4_ - fVar8;
      local_80.data_._0_4_ = fVar8;
      bVar5 = 2;
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        if (NAN(fVar8)) goto LAB_002117a7;
        bVar5 = 1;
        if (ABS(fVar8) == INFINITY) goto LAB_002115e8;
LAB_002115e2:
        bVar5 = (1.1754944e-38 <= ABS(fVar8)) + 3;
      }
      goto LAB_002115e8;
    }
    dVar1 = analysis::Constant::GetDouble(input1);
    local_58._8_4_ = extraout_XMM0_Dc_00;
    local_58._0_8_ = dVar1;
    local_58._12_4_ = extraout_XMM0_Dd_00;
    dVar1 = analysis::Constant::GetDouble(input2);
    local_80.data_ = (uint_type)((double)local_58._0_8_ - dVar1);
    bVar5 = 2;
    if (((double)local_80.data_ != 0.0) || (NAN((double)local_80.data_))) {
      if (!NAN((double)local_80.data_)) {
        bVar5 = 1;
        if (ABS((double)local_80.data_) == INFINITY) break;
        goto LAB_002114cd;
      }
      goto LAB_002117a0;
    }
    break;
  case OpFMul:
    if (iVar6 != 0x40) {
      fVar8 = analysis::Constant::GetFloat(input1);
      local_58._0_4_ = fVar8;
      fVar8 = analysis::Constant::GetFloat(input2);
      fVar8 = fVar8 * (float)local_58._0_4_;
      goto LAB_00211599;
    }
    local_58._0_8_ = analysis::Constant::GetDouble(input1);
    dVar1 = analysis::Constant::GetDouble(input2);
    local_80.data_ = (uint_type)(dVar1 * (double)local_58._0_8_);
LAB_00211341:
    bVar5 = 2;
    if (((double)local_80.data_ != 0.0) || (NAN((double)local_80.data_))) {
      if (NAN((double)local_80.data_)) {
LAB_002117a0:
        bVar5 = 0;
      }
      else {
        bVar5 = 1;
        if (ABS((double)local_80.data_) != INFINITY) {
LAB_002114cd:
          bVar5 = (2.2250738585072014e-308 <= ABS((double)local_80.data_)) + 3;
        }
      }
    }
    break;
  case OpFDiv:
    bVar4 = HasZero(input2);
    uVar7 = 0;
    if (bVar4) goto LAB_002115fd;
    if (iVar6 != 0x40) {
      local_58._0_4_ = analysis::Constant::GetFloat(input1);
      local_58._4_4_ = extraout_XMM0_Db_00;
      local_58._8_4_ = extraout_XMM0_Dc_02;
      local_58._12_4_ = extraout_XMM0_Dd_02;
      local_80.data_._0_4_ = analysis::Constant::GetFloat(input2);
      local_80.data_._0_4_ = (float)local_58._0_4_ / (float)local_80.data_;
      bVar5 = 2;
      if (((float)local_80.data_ != 0.0) || (NAN((float)local_80.data_))) {
        if (NAN((float)local_80.data_)) {
          bVar5 = 0;
        }
        else {
          bVar5 = 1;
          if (ABS((float)local_80.data_) != INFINITY) {
            bVar5 = (1.1754944e-38 <= ABS((float)local_80.data_)) + 3;
          }
        }
      }
      if ((bVar5 < 4) && (uVar7 = 0, bVar5 != 2)) goto LAB_002115fd;
      goto LAB_0021169e;
    }
    dVar1 = analysis::Constant::GetDouble(input1);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_8_ = dVar1;
    local_58._12_4_ = extraout_XMM0_Dd;
    dVar1 = analysis::Constant::GetDouble(input2);
    local_80.data_ = (uint_type)((double)local_58._0_8_ / dVar1);
    bVar5 = 2;
    if (((double)local_80.data_ != 0.0) || (NAN((double)local_80.data_))) {
      if (NAN((double)local_80.data_)) {
        bVar5 = 0;
      }
      else {
        bVar5 = 1;
        if (ABS((double)local_80.data_) != INFINITY) {
          bVar5 = (2.2250738585072014e-308 <= ABS((double)local_80.data_)) + 3;
        }
      }
    }
    if ((bVar5 < 4) && (bVar5 != 2)) goto LAB_002115fd;
    goto LAB_002114e1;
  }
  if ((bVar5 < 4) && (bVar5 != 2)) {
LAB_002115fa:
    uVar7 = 0;
  }
  else {
LAB_002114e1:
    utils::FloatProxy<double>::GetWords(&local_48,&local_80);
LAB_002116b0:
    puVar3 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar2 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    }
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    c = analysis::ConstantManager::GetConstant(const_mgr,type,&local_78);
    this = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0);
    uVar7 = 0;
    if (this->has_result_id_ == true) {
      uVar7 = Instruction::GetSingleWordOperand(this,(uint)this->has_type_id_);
    }
  }
LAB_002115fd:
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return uVar7;
}

Assistant:

uint32_t PerformFloatingPointOperation(analysis::ConstantManager* const_mgr,
                                       spv::Op opcode,
                                       const analysis::Constant* input1,
                                       const analysis::Constant* input2) {
  const analysis::Type* type = input1->type();
  assert(type->AsFloat());
  uint32_t width = type->AsFloat()->width();
  assert(width == 32 || width == 64);
  std::vector<uint32_t> words;
#define FOLD_OP(op)                                                          \
  if (width == 64) {                                                         \
    utils::FloatProxy<double> val =                                          \
        input1->GetDouble() op input2->GetDouble();                          \
    double dval = val.getAsFloat();                                          \
    if (!IsValidResult(dval)) return 0;                                      \
    words = val.GetWords();                                                  \
  } else {                                                                   \
    utils::FloatProxy<float> val = input1->GetFloat() op input2->GetFloat(); \
    float fval = val.getAsFloat();                                           \
    if (!IsValidResult(fval)) return 0;                                      \
    words = val.GetWords();                                                  \
  }                                                                          \
  static_assert(true, "require extra semicolon")
  switch (opcode) {
    case spv::Op::OpFMul:
      FOLD_OP(*);
      break;
    case spv::Op::OpFDiv:
      if (HasZero(input2)) return 0;
      FOLD_OP(/);
      break;
    case spv::Op::OpFAdd:
      FOLD_OP(+);
      break;
    case spv::Op::OpFSub:
      FOLD_OP(-);
      break;
    default:
      assert(false && "Unexpected operation");
      break;
  }
#undef FOLD_OP
  const analysis::Constant* merged_const = const_mgr->GetConstant(type, words);
  return const_mgr->GetDefiningInstruction(merged_const)->result_id();
}